

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
either<toml::detail::sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  bool bVar1;
  undefined1 local_68 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  location *loc_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)loc;
  sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>::invoke
            ((result<toml::detail::region,_toml::detail::none_t> *)local_68,loc);
  bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_ok
                    ((result<toml::detail::region,_toml::detail::none_t> *)local_68);
  if (bVar1) {
    result<toml::detail::region,_toml::detail::none_t>::result
              (__return_storage_ptr__,(result<toml::detail::region,_toml::detail::none_t> *)local_68
              );
  }
  else {
    either<toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>
    ::invoke(__return_storage_ptr__,(location *)rslt.field_1.succ.value.last_._M_current);
  }
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }